

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  StructUnionMemberSyntax *pSVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::DataTypeSyntax_*>::operator*
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0x822b6b);
  deepClone<slang::syntax::DataTypeSyntax>
            ((DataTypeSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  deepClone<slang::syntax::DeclaratorSyntax>(in_stack_00000100,in_stack_000000f8);
  TVar3 = parsing::Token::deepClone((Token *)in_stack_00000100,in_stack_000000f8);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::StructUnionMemberSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>&,slang::parsing::Token>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      args_1,(DataTypeSyntax *)TVar2.info,TVar2._0_8_,(Token *)TVar3.info);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const StructUnionMemberSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<StructUnionMemberSyntax>(
        *deepClone(node.attributes, alloc),
        node.randomQualifier.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        *deepClone(node.declarators, alloc),
        node.semi.deepClone(alloc)
    );
}